

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O3

string * __thiscall
oout::FmtJunitXml::test
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,
          shared_ptr<const_oout::Result> *assertion_result,nanoseconds *duration)

{
  long lVar1;
  element_type *peVar2;
  ostream *poVar3;
  ostringstream out;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  lVar1 = duration->__r;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"<testcase ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"name=\'",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"time=\'",6);
  poVar3 = std::ostream::_M_insert<double>((double)((float)lVar1 / 1e+09));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'>",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  peVar2 = (assertion_result->super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (*peVar2->_vptr_Result[2])(&local_1c0,peVar2,this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</testcase>",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string test(
		const string &name,
		const shared_ptr<const Result> &assertion_result,
		const chrono::nanoseconds &duration
	) const override
	{
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();
		ostringstream out;
		out << "<testcase "
		    << "name='" << name << "' "
		    << "time='" << time << "'>" << endl
		    << assertion_result->print(*this)
		    << "</testcase>" << endl;
		return out.str();
	}